

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O3

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *heapBucket,
          SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar5;
  undefined8 *in_FS_OFFSET;
  
  if (Js::Configuration::Global[0x2c158] == '\x01') {
    uVar4 = HeapInfo::GetMediumBucketIndex((ulong)(heapBucket->super_HeapBucket).sizeCat);
    if ((HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *)
        (heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).heapBucket != heapBucket
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar3) goto LAB_0023827b;
      *puVar1 = 0;
    }
    SmallHeapBlockT<MediumAllocationBlockAttributes>::BackgroundReleasePagesSweep
              (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>,this->recycler);
    pSVar5 = &((this->mediumLeafData).bucketData[uVar4].pendingEmptyBlockList)->
              super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
    if (pSVar5 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      if ((this->mediumLeafData).bucketData[uVar4].pendingEmptyBlockListTail !=
          (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar3) {
LAB_0023827b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar1 = 0;
      }
      (this->mediumLeafData).bucketData[uVar4].pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
      pSVar5 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    (heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next = pSVar5;
    (this->mediumLeafData).bucketData[uVar4].pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}